

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O2

void under_ground(int mode)

{
  if ((u._1052_1_ & 1) == 0) {
    if ((mode == 1) || ((under_ground_dela & 1) != 0)) {
      memset(dbuf,0,0x9d80);
      under_ground_dela = 0;
      return;
    }
    if (mode != 2) {
      newsym((int)u.ux,(int)u.uy);
      return;
    }
    under_ground_dela = 1;
  }
  return;
}

Assistant:

void under_ground(int mode)
{
    static boolean dela;

    /* swallowing has a higher precedence than under ground */
    if (u.uswallow) return;

    /* full update */
    if (mode == 1 || dela) {
	cls();
	dela = FALSE;
    }
    /* delayed full update */
    else if (mode == 2) {
	dela = TRUE;
	return;
    }
    /* limited update */
    else
	newsym(u.ux,u.uy);
}